

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptPostfixExpression(HlslGrammar *this,TIntermTyped **node)

{
  HlslToken *pHVar1;
  HlslParseContext *this_00;
  char *__s;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  EHlslTokenClass op;
  TOperator op_00;
  int iVar5;
  TIntermTyped *pTVar6;
  undefined4 extraout_var;
  TPoolAllocator *this_01;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 this_02;
  char *pcVar7;
  HlslToken field;
  HlslToken idToken;
  TSourceLoc loc;
  HlslToken local_a8;
  HlslToken local_78;
  TSourceLoc local_48;
  
  local_78.field_2.string =
       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0;
  local_78.loc.name = (TString *)0x0;
  local_78.loc.string = 0;
  local_78.loc.line = 0;
  local_78.loc.column = 0;
  bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (!bVar3) {
    bVar3 = acceptLiteral(this,node);
    if ((!bVar3) && (bVar3 = acceptConstructor(this,node), !bVar3)) {
      bVar3 = acceptIdentifier(this,&local_78);
      this_02 = local_78.field_2;
      if (!bVar3) {
        return false;
      }
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColonColon);
      if (bVar3) {
        pcVar7 = "identifier after ::";
        do {
          __s = ((this_02.string)->_M_dataplus)._M_p;
          this_01 = GetThreadPoolAllocator();
          this_02.string = (TString *)TPoolAllocator::allocate(this_01,0x28);
          local_a8.loc.name = (TString *)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     this_02.string,__s,(pool_allocator<char> *)&local_a8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_02.string,(this->parseContext->super_TParseContextBase).scopeMangler);
          bVar3 = acceptIdentifier(this,&local_78);
          if (!bVar3) goto LAB_003a86de;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          _M_append(this_02.string,((local_78.field_2.string)->_M_dataplus)._M_p,
                    (local_78.field_2.string)->_M_string_length);
          bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColonColon);
        } while (bVar3);
      }
      bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
      if (bVar3) {
        bVar3 = acceptFunctionCall(this,&local_78.loc,this_02.string,node,(TIntermTyped *)0x0);
        if (!bVar3) {
          pcVar7 = "function call arguments";
          goto LAB_003a86de;
        }
      }
      else {
        pTVar6 = HlslParseContext::handleVariable(this->parseContext,&local_78.loc,this_02.string);
        *node = pTVar6;
        if (pTVar6 == (TIntermTyped *)0x0) {
          return false;
        }
      }
    }
LAB_003a8473:
    pHVar1 = &(this->super_HlslTokenStream).token;
    bVar3 = false;
    do {
      local_48.column = (this->super_HlslTokenStream).token.loc.column;
      local_48._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      local_48.name = (pHVar1->loc).name;
      local_48.string = (this->super_HlslTokenStream).token.loc.string;
      local_48.line = (this->super_HlslTokenStream).token.loc.line;
      op = HlslTokenStream::peek(&this->super_HlslTokenStream);
      op_00 = HlslOpMap::postUnary(op);
      bVar4 = false;
      bVar2 = true;
      if ((op_00 < EOpRadians) && ((0x130000000003000U >> ((ulong)op_00 & 0x3f) & 1) != 0)) {
        HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
        if ((int)op_00 < 0x35) {
          if (op_00 - EOpPostIncrement < 2) {
            pTVar6 = TIntermediate::addUnaryMath(this->intermediate,op_00,*node,&local_48);
            *node = pTVar6;
            pTVar6 = HlslParseContext::handleLvalue
                               (this->parseContext,&local_48,"unary operator",node);
            *node = pTVar6;
          }
          else {
            if (op_00 != EOpIndexIndirect) goto LAB_003a883f;
            local_a8.loc.name = (TString *)0x0;
            bVar4 = acceptExpression(this,(TIntermTyped **)&local_a8);
            if ((bVar4) &&
               (bVar4 = HlslTokenStream::peekTokenClass
                                  (&this->super_HlslTokenStream,EHTokRightBracket), bVar4)) {
              HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
              this_00 = this->parseContext;
              iVar5 = (**((TIntermNode *)&(local_a8.loc.name)->_M_dataplus)->_vptr_TIntermNode)();
              pTVar6 = HlslParseContext::handleBracketDereference
                                 (this_00,(TSourceLoc *)CONCAT44(extraout_var,iVar5),*node,
                                  (TIntermTyped *)local_a8.loc.name);
              *node = pTVar6;
              bVar4 = pTVar6 != (TIntermTyped *)0x0;
              bVar3 = (bool)(bVar3 & bVar4);
            }
            else {
              bVar4 = false;
              (*(this->parseContext->super_TParseContextBase).super_TParseVersions.
                _vptr_TParseVersions[0x2d])
                        (this->parseContext,pHVar1,"Expected","expression followed by \']\'","");
              bVar3 = false;
            }
            if (!bVar4) {
              bVar4 = false;
              bVar2 = bVar3;
              goto LAB_003a86c6;
            }
          }
        }
        else {
          if ((op_00 != EOpScoping) && (op_00 != EOpIndexDirectStruct)) {
LAB_003a883f:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                          ,0xdb2,
                          "bool glslang::HlslGrammar::acceptPostfixExpression(TIntermTyped *&)");
          }
          local_a8.field_2.string = (TString *)0x0;
          local_a8.loc.name = (TString *)0x0;
          local_a8.loc.string = 0;
          local_a8.loc.line = 0;
          local_a8.loc.column = 0;
          bVar4 = acceptIdentifier(this,&local_a8);
          if (bVar4) {
            bVar4 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
            if (bVar4) {
              bVar4 = acceptFunctionCall(this,&local_a8.loc,local_a8.field_2.string,node,*node);
              if (!bVar4) {
                bVar3 = false;
                (*(this->parseContext->super_TParseContextBase).super_TParseVersions.
                  _vptr_TParseVersions[0x2d])
                          (this->parseContext,pHVar1,"Expected","function parameters","");
              }
            }
            else {
              pTVar6 = HlslParseContext::handleDotDereference
                                 (this->parseContext,&local_a8.loc,*node,local_a8.field_2.string);
              *node = pTVar6;
              bVar4 = true;
            }
          }
          else {
            bVar4 = false;
            (*(this->parseContext->super_TParseContextBase).super_TParseVersions.
              _vptr_TParseVersions[0x2d])
                      (this->parseContext,pHVar1,"Expected","swizzle or member","");
            bVar3 = false;
          }
          if (bVar4 == false) {
            bVar4 = false;
            bVar2 = bVar3;
            goto LAB_003a86c6;
          }
        }
        bVar4 = true;
        bVar2 = bVar3;
      }
LAB_003a86c6:
      bVar3 = bVar2;
      if (!bVar4) {
        return bVar3;
      }
    } while( true );
  }
  bVar3 = acceptExpression(this,node);
  if (bVar3) {
    bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (bVar3) goto LAB_003a8473;
    pcVar7 = ")";
  }
  else {
    pcVar7 = "expression";
  }
LAB_003a86de:
  (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this->parseContext,&(this->super_HlslTokenStream).token,"Expected",pcVar7,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptPostfixExpression(TIntermTyped*& node)
{
    // Not implemented as self-recursive:
    // The logical "right recursion" is done with a loop at the end

    // idToken will pick up either a variable or a function name in a function call
    HlslToken idToken;

    // Find something before the postfix operations, as they can't operate
    // on nothing.  So, no "return true", they fall through, only "return false".
    if (acceptTokenClass(EHTokLeftParen)) {
        // LEFT_PAREN expression RIGHT_PAREN
        if (! acceptExpression(node)) {
            expected("expression");
            return false;
        }
        if (! acceptTokenClass(EHTokRightParen)) {
            expected(")");
            return false;
        }
    } else if (acceptLiteral(node)) {
        // literal (nothing else to do yet)
    } else if (acceptConstructor(node)) {
        // constructor (nothing else to do yet)
    } else if (acceptIdentifier(idToken)) {
        // user-type, namespace name, variable, or function name
        TString* fullName = idToken.string;
        while (acceptTokenClass(EHTokColonColon)) {
            // user-type or namespace name
            fullName = NewPoolTString(fullName->c_str());
            fullName->append(parseContext.scopeMangler);
            if (acceptIdentifier(idToken))
                fullName->append(*idToken.string);
            else {
                expected("identifier after ::");
                return false;
            }
        }
        if (! peekTokenClass(EHTokLeftParen)) {
            node = parseContext.handleVariable(idToken.loc, fullName);
            if (node == nullptr)
                return false;
        } else if (acceptFunctionCall(idToken.loc, *fullName, node, nullptr)) {
            // function_call (nothing else to do yet)
        } else {
            expected("function call arguments");
            return false;
        }
    } else {
        // nothing found, can't post operate
        return false;
    }

    // Something was found, chain as many postfix operations as exist.
    do {
        TSourceLoc loc = token.loc;
        TOperator postOp = HlslOpMap::postUnary(peek());

        // Consume only a valid post-unary operator, otherwise we are done.
        switch (postOp) {
        case EOpIndexDirectStruct:
        case EOpIndexIndirect:
        case EOpPostIncrement:
        case EOpPostDecrement:
        case EOpScoping:
            advanceToken();
            break;
        default:
            return true;
        }

        // We have a valid post-unary operator, process it.
        switch (postOp) {
        case EOpScoping:
        case EOpIndexDirectStruct:
        {
            // DOT IDENTIFIER
            // includes swizzles, member variables, and member functions
            HlslToken field;
            if (! acceptIdentifier(field)) {
                expected("swizzle or member");
                return false;
            }

            if (peekTokenClass(EHTokLeftParen)) {
                // member function
                TIntermTyped* thisNode = node;

                // arguments
                if (! acceptFunctionCall(field.loc, *field.string, node, thisNode)) {
                    expected("function parameters");
                    return false;
                }
            } else
                node = parseContext.handleDotDereference(field.loc, node, *field.string);

            break;
        }
        case EOpIndexIndirect:
        {
            // LEFT_BRACKET integer_expression RIGHT_BRACKET
            TIntermTyped* indexNode = nullptr;
            if (! acceptExpression(indexNode) ||
                ! peekTokenClass(EHTokRightBracket)) {
                expected("expression followed by ']'");
                return false;
            }
            advanceToken();
            node = parseContext.handleBracketDereference(indexNode->getLoc(), node, indexNode);
            if (node == nullptr)
                return false;
            break;
        }
        case EOpPostIncrement:
            // INC_OP
            // fall through
        case EOpPostDecrement:
            // DEC_OP
            node = intermediate.addUnaryMath(postOp, node, loc);
            node = parseContext.handleLvalue(loc, "unary operator", node);
            break;
        default:
            assert(0);
            break;
        }
    } while (true);
}